

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instructions_list.c
# Opt level: O0

void movhps_VM(PDISASM pMyDisasm)

{
  int iVar1;
  PDISASM pMyDisasm_local;
  
  if ((pMyDisasm->Reserved_).VEX.state == '\x01') {
    if ((pMyDisasm->Reserved_).VEX.pp == '\x01') {
      iVar1 = Security(2,pMyDisasm);
      if (iVar1 != 0) {
        (pMyDisasm->Reserved_).MOD_ = (int)(uint)*(byte *)((pMyDisasm->Reserved_).EIP_ + 1) >> 6;
        if ((pMyDisasm->Reserved_).MOD_ == 3) {
          failDecode(pMyDisasm);
        }
        else {
          if ((pMyDisasm->Reserved_).EVEX.state == '\x01') {
            (pMyDisasm->Reserved_).EVEX.tupletype = '\b';
          }
          ArgsVEX(pMyDisasm);
          strcpy((pMyDisasm->Instruction).Mnemonic,"vmovhpd");
          (pMyDisasm->Reserved_).MemDecoration = 0xcc;
        }
      }
    }
    else if ((pMyDisasm->Reserved_).VEX.pp == '\x02') {
      if ((pMyDisasm->Reserved_).EVEX.state == '\x01') {
        (pMyDisasm->Reserved_).EVEX.tupletype = '\x03';
      }
      strcpy((pMyDisasm->Instruction).Mnemonic,"vmovshdup");
      vex_GxEx(pMyDisasm);
    }
    else if ((pMyDisasm->Reserved_).VEX.pp == '\0') {
      if ((pMyDisasm->Reserved_).VEX.L == '\x01') {
        failDecode(pMyDisasm);
      }
      else {
        ArgsVEX(pMyDisasm);
        if ((pMyDisasm->Reserved_).MOD_ == 3) {
          strcpy((pMyDisasm->Instruction).Mnemonic,"vmovlhps");
        }
        else {
          strcpy((pMyDisasm->Instruction).Mnemonic,"vmovhps");
          if ((pMyDisasm->Reserved_).EVEX.state == '\x01') {
            (pMyDisasm->Reserved_).EVEX.tupletype = '\t';
          }
          (pMyDisasm->Reserved_).MemDecoration = 0xcc;
        }
      }
    }
    else {
      failDecode(pMyDisasm);
    }
  }
  else if ((pMyDisasm->Reserved_).PrefRepe == 1) {
    (pMyDisasm->Prefix).RepPrefix = '\b';
    (pMyDisasm->Reserved_).MemDecoration = 0x6d;
    (pMyDisasm->Instruction).Category = 0x60001;
    strcpy((pMyDisasm->Instruction).Mnemonic,"movshdup");
    (pMyDisasm->Reserved_).Register_ = 4;
    GxEx(pMyDisasm);
  }
  else if ((pMyDisasm->Prefix).OperandSize == '\x01') {
    (pMyDisasm->Reserved_).OperandSize = (pMyDisasm->Reserved_).OriginalOperandSize;
    (pMyDisasm->Prefix).OperandSize = '\b';
    (pMyDisasm->Reserved_).MemDecoration = 0x68;
    (pMyDisasm->Instruction).Category = 0x50001;
    strcpy((pMyDisasm->Instruction).Mnemonic,"movhpd");
    (pMyDisasm->Reserved_).Register_ = 4;
    GxEx(pMyDisasm);
    (pMyDisasm->Operand1).AccessMode = 3;
  }
  else {
    (pMyDisasm->Reserved_).MemDecoration = 0x68;
    (pMyDisasm->Instruction).Category = 0x40001;
    iVar1 = Security(2,pMyDisasm);
    if (iVar1 != 0) {
      (pMyDisasm->Reserved_).MOD_ = (int)(uint)*(byte *)((pMyDisasm->Reserved_).EIP_ + 1) >> 6;
      if ((pMyDisasm->Reserved_).MOD_ == 3) {
        strcpy((pMyDisasm->Instruction).Mnemonic,"movlhps");
      }
      else {
        strcpy((pMyDisasm->Instruction).Mnemonic,"movhps");
      }
      (pMyDisasm->Reserved_).Register_ = 4;
      GxEx(pMyDisasm);
      (pMyDisasm->Operand1).AccessMode = 3;
    }
  }
  return;
}

Assistant:

void __bea_callspec__ movhps_VM(PDISASM pMyDisasm)
{
 if (GV.VEX.state == InUsePrefix) {
   if (GV.VEX.pp == 0x1) {
     if (!Security(2, pMyDisasm)) return;
     GV.MOD_= ((*((UInt8*) (GV.EIP_+1))) >> 6) & 0x3;
     if (GV.MOD_ == 0x3) {
       failDecode(pMyDisasm);
     }
     else {
       if (GV.EVEX.state == InUsePrefix) GV.EVEX.tupletype = TUPLE1_FIXED__64;
       ArgsVEX(pMyDisasm);
       #ifndef BEA_LIGHT_DISASSEMBLY
          (void) strcpy (pMyDisasm->Instruction.Mnemonic, "vmovhpd");
       #endif
       GV.MemDecoration = Arg3qword;
     }
   }
   else if (GV.VEX.pp == 0x2) {
     if (GV.EVEX.state == InUsePrefix) GV.EVEX.tupletype = FULL_MEM;
     #ifndef BEA_LIGHT_DISASSEMBLY
        (void) strcpy (pMyDisasm->Instruction.Mnemonic, "vmovshdup");
     #endif
     vex_GxEx(pMyDisasm);
   }
   else if (GV.VEX.pp == 0x0) {
     if (GV.VEX.L == 1) { failDecode(pMyDisasm); return; }
     ArgsVEX(pMyDisasm);
     if (GV.MOD_ == 0x3) {
       #ifndef BEA_LIGHT_DISASSEMBLY
          (void) strcpy (pMyDisasm->Instruction.Mnemonic, "vmovlhps");
       #endif
     }
     else {
       #ifndef BEA_LIGHT_DISASSEMBLY
          (void) strcpy (pMyDisasm->Instruction.Mnemonic, "vmovhps");
       #endif
       if (GV.EVEX.state == InUsePrefix) GV.EVEX.tupletype = TUPLE2;
       GV.MemDecoration = Arg3qword;
     }
   }
   else {
     failDecode(pMyDisasm);
   }
 }
 else {
   /* ========= 0xf3 */
   if (GV.PrefRepe == 1) {
     pMyDisasm->Prefix.RepPrefix = MandatoryPrefix;
     GV.MemDecoration = Arg2_m128_xmm;
     pMyDisasm->Instruction.Category = SSE3_INSTRUCTION+DATA_TRANSFER;
     #ifndef BEA_LIGHT_DISASSEMBLY
        (void) strcpy (pMyDisasm->Instruction.Mnemonic, "movshdup");
     #endif
     GV.Register_ = SSE_REG;
     GxEx(pMyDisasm);

   }
   /* ========== 0x66 */
   else if (pMyDisasm->Prefix.OperandSize == InUsePrefix) {
     GV.OperandSize = GV.OriginalOperandSize;
     pMyDisasm->Prefix.OperandSize = MandatoryPrefix;
     GV.MemDecoration = Arg2qword;
     pMyDisasm->Instruction.Category = SSE2_INSTRUCTION+DATA_TRANSFER;
     #ifndef BEA_LIGHT_DISASSEMBLY
        (void) strcpy (pMyDisasm->Instruction.Mnemonic, "movhpd");
     #endif
     GV.Register_ = SSE_REG;
     GxEx(pMyDisasm);
     pMyDisasm->Operand1.AccessMode = READ + WRITE;

   }
   else {
     GV.MemDecoration = Arg2qword;
     pMyDisasm->Instruction.Category = SSE_INSTRUCTION+DATA_TRANSFER;
     if (!Security(2, pMyDisasm)) return;
     GV.MOD_= ((*((UInt8*) (GV.EIP_+1))) >> 6) & 0x3;
     if (GV.MOD_== 0x3) {
       #ifndef BEA_LIGHT_DISASSEMBLY
          (void) strcpy (pMyDisasm->Instruction.Mnemonic, "movlhps");
       #endif
     }
     else {
       #ifndef BEA_LIGHT_DISASSEMBLY
          (void) strcpy (pMyDisasm->Instruction.Mnemonic, "movhps");
       #endif
     }
     GV.Register_ = SSE_REG;
     GxEx(pMyDisasm);
     pMyDisasm->Operand1.AccessMode = READ + WRITE;

   }
 }
}